

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hh
# Opt level: O0

fixed_depth_iterator * __thiscall
tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
fixed_depth_iterator::operator++(fixed_depth_iterator *this)

{
  tree_node_<libDAI::BoundTreeNode> *ptVar1;
  bool bVar2;
  int relative_depth;
  fixed_depth_iterator *this_local;
  
  if (((this->super_iterator_base).node)->next_sibling == (tree_node_<libDAI::BoundTreeNode> *)0x0)
  {
    relative_depth = 0;
LAB_00b13b67:
    (this->super_iterator_base).node = ((this->super_iterator_base).node)->parent;
    if ((this->super_iterator_base).node != (tree_node *)0x0) {
      relative_depth = relative_depth + -1;
      ptVar1 = ((this->super_iterator_base).node)->next_sibling;
      while (ptVar1 != (tree_node_<libDAI::BoundTreeNode> *)0x0) {
        (this->super_iterator_base).node = ((this->super_iterator_base).node)->next_sibling;
        while (((this->super_iterator_base).node)->first_child ==
               (tree_node_<libDAI::BoundTreeNode> *)0x0) {
          if (((this->super_iterator_base).node)->next_sibling ==
              (tree_node_<libDAI::BoundTreeNode> *)0x0) goto LAB_00b13b67;
          (this->super_iterator_base).node = ((this->super_iterator_base).node)->next_sibling;
          if ((this->super_iterator_base).node == (tree_node *)0x0) {
            return this;
          }
        }
        while( true ) {
          bVar2 = false;
          if (relative_depth < 0) {
            bVar2 = ((this->super_iterator_base).node)->first_child !=
                    (tree_node_<libDAI::BoundTreeNode> *)0x0;
          }
          if (!bVar2) break;
          (this->super_iterator_base).node = ((this->super_iterator_base).node)->first_child;
          relative_depth = relative_depth + 1;
        }
        if (-1 < relative_depth) {
          return this;
        }
        ptVar1 = ((this->super_iterator_base).node)->next_sibling;
      }
      goto LAB_00b13b67;
    }
  }
  else {
    (this->super_iterator_base).node = ((this->super_iterator_base).node)->next_sibling;
  }
  return this;
}

Assistant:

typename tree<T, tree_node_allocator>::fixed_depth_iterator& tree<T, tree_node_allocator>::fixed_depth_iterator::operator++()
   {
   assert(this->node!=0);

   if(this->node->next_sibling) {
      this->node=this->node->next_sibling;
      }
   else { 
      int relative_depth=0;
      upper:
      do {
         this->node=this->node->parent;
         if(this->node==0) return *this;
         --relative_depth;
         } while(this->node->next_sibling==0);
      lower:
      this->node=this->node->next_sibling;
      while(this->node->first_child==0) {
         if(this->node->next_sibling==0)
            goto upper;
         this->node=this->node->next_sibling;
         if(this->node==0) return *this;
         }
      while(relative_depth<0 && this->node->first_child!=0) {
         this->node=this->node->first_child;
         ++relative_depth;
         }
      if(relative_depth<0) {
         if(this->node->next_sibling==0) goto upper;
         else                          goto lower;
         }
      }
   return *this;

// if(this->node->next_sibling!=0) {
//    this->node=this->node->next_sibling;
//    assert(this->node!=0);
//    if(this->node->parent==0 && this->node->next_sibling==0) // feet element
//       this->node=0;
//    }
// else {
//    tree_node *par=this->node->parent;
//    do {
//       par=par->next_sibling;
//       if(par==0) { // FIXME: need to keep track of this!
//          this->node=0;
//          return *this;
//          }
//       } while(par->first_child==0);
//    this->node=par->first_child;
//    }
   return *this;
   }